

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::paintEvent(QLineEdit *this,QPaintEvent *param_1)

{
  int iVar1;
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar2;
  qreal qVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  Alignment AVar8;
  Alignment AVar9;
  undefined4 uVar10;
  QPalette *pQVar11;
  QStyle *pQVar12;
  int extraout_var;
  int extraout_var_00;
  long *plVar13;
  QPen *pQVar14;
  QStyleSheetStyle *this_01;
  undefined8 uVar15;
  int extraout_var_01;
  int extraout_var_02;
  char16_t *extraout_RDX;
  LayoutDirection LVar16;
  int iVar17;
  int iVar18;
  QPoint QVar19;
  long in_FS_OFFSET;
  bool bVar20;
  double dVar21;
  QMargins QVar22;
  QPoint topLeft;
  QFontMetrics fm;
  QPainter p;
  QStyleOptionFrame panel;
  QPoint local_158;
  char16_t *pcStack_150;
  qsizetype local_148;
  QString local_138;
  QStringBuilder<QString,_QString> local_118;
  undefined1 *local_e0;
  undefined1 local_d8 [12];
  Representation RStack_cc;
  undefined1 local_c0 [8];
  QString local_b8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  local_c0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_c0,&(this->super_QWidget).super_QPaintDevice);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar11 = QWidget::palette(&this->super_QWidget);
  QPalette::QPalette((QPalette *)local_48,pQVar11);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_98);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionFrame *)local_98);
  pQVar12 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar12 + 0xb0))
            (pQVar12,0x12,(QStyleOptionFrame *)local_98,(QRect *)local_c0,this);
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar12 = QWidget::style(&this->super_QWidget);
  _local_d8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xc0))
                               (pQVar12,0x1a,(QStyleOptionFrame *)local_98,this);
  QVar22 = QLineEditPrivate::effectiveTextMargins(this_00);
  uVar15._0_4_ = local_d8._0_4_ + QVar22.m_left.m_i.m_i;
  local_d8._8_4_ = local_d8._8_4_ - QVar22.m_right.m_i;
  uVar15._4_4_ = QVar22.m_top.m_i.m_i + local_d8._4_4_;
  RStack_cc.m_i = RStack_cc.m_i - QVar22.m_bottom.m_i;
  local_d8._0_8_ = uVar15;
  QPainter::setClipRect((QRect *)local_c0,(ClipOperation)local_d8);
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_e0,&((this->super_QWidget).data)->fnt);
  bVar4 = QLineEditPrivate::shouldShowPlaceholderText(this_00);
  if (bVar4) {
    QFontMetrics::boundingRect((QString *)&local_e0);
    iVar18 = extraout_var_01 - extraout_var;
  }
  else {
    QWidgetLineControl::text(&local_138,(QWidgetLineControl *)this_00->control);
    QTextLayout::preeditAreaText();
    local_118.a.d.size = local_138.d.size;
    local_118.a.d.ptr = local_138.d.ptr;
    local_118.a.d.d = local_138.d.d;
    local_118.b.d.size = local_148;
    local_118.b.d.ptr = pcStack_150;
    local_118.b.d.d = (Data *)local_158;
    local_138.d.d = (Data *)0x0;
    local_138.d.ptr = (char16_t *)0x0;
    local_138.d.size = 0;
    local_158.xp.m_i = 0;
    local_158.yp.m_i = 0;
    pcStack_150 = (char16_t *)0x0;
    local_148 = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>(&local_b8,&local_118);
    QFontMetrics::boundingRect((QString *)&local_e0);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_118);
    if (local_158 != (QPoint)0x0) {
      LOCK();
      *(int *)local_158 = *(int *)local_158 + -1;
      UNLOCK();
      if (*(int *)local_158 == 0) {
        QArrayData::deallocate((QArrayData *)local_158,2,0x10);
      }
    }
    iVar18 = extraout_var_02 - extraout_var_00;
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar7 = QFontMetrics::height();
  if (iVar7 < iVar18 + 1) {
    iVar7 = iVar18 + 1;
  }
  LVar16 = this_00->control->m_layoutDirection;
  if ((LVar16 == LayoutDirectionAuto) && ((this_00->control->m_text).d.size != 0)) {
    bVar5 = QString::isRightToLeft();
    LVar16 = (LayoutDirection)bVar5;
  }
  AVar8 = QStyle::visualAlignment(LVar16,(Alignment)this_00->alignment);
  if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0) == 0x20) {
    iVar18 = local_d8._4_4_ + 1;
  }
  else if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0) == 0x40) {
    iVar18 = (RStack_cc.m_i - (iVar7 + 1)) + 1;
  }
  else {
    iVar18 = (RStack_cc.m_i - iVar7) - local_d8._4_4_;
    iVar18 = ((iVar18 - (iVar18 + 2 >> 0x1f)) + 2 >> 1) + local_d8._4_4_;
  }
  this_00->vscroll = iVar18;
  local_138.d.d = (Data *)CONCAT44(this_00->vscroll,local_d8._0_4_ + 2);
  local_138.d.ptr = (char16_t *)CONCAT44(iVar7 + this_00->vscroll + -1,local_d8._8_4_ + -2);
  bVar4 = QLineEditPrivate::shouldShowPlaceholderText(this_00);
  if ((bVar4) && ((this_00->placeholderText).d.size != 0)) {
    bVar5 = QString::isRightToLeft();
    AVar9 = QStyle::visualAlignment((uint)bVar5,(Alignment)this_00->alignment);
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    plVar13 = (long *)QPalette::brush((ColorGroup)local_48,Dark);
    local_b8.d.d = *(Data **)(*plVar13 + 8);
    local_b8.d.ptr = *(char16_t **)(*plVar13 + 0x10);
    local_158 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = (QPen *)QPainter::pen();
    QPen::QPen((QPen *)&local_158,pQVar14);
    QPainter::setPen((QColor *)local_c0);
    QPainter::layoutDirection();
    LVar16 = (LayoutDirection)(QRect *)local_c0;
    QPainter::setLayoutDirection(LVar16);
    local_118.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_118.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::elidedText((QString *)&local_118,(TextElideMode)&local_e0,(int)this_00 + 0x2a8,1);
    QPainter::drawText((QRect *)local_c0,(int)&local_138,
                       (QString *)
                       (ulong)(uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                    super_QFlagsStorage<Qt::AlignmentFlag>.i,(QRect *)&local_118);
    QPainter::setPen((QPen *)local_c0);
    QPainter::setLayoutDirection(LVar16);
    if (&(local_118.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QPen::~QPen((QPen *)&local_158);
  }
  qVar3 = QWidgetLineControl::cursorToX((QWidgetLineControl *)this_00->control);
  uVar10 = QTextLayout::lineAt((int)this_00->control + 0x118);
  local_118.a.d.d = (Data *)CONCAT44(local_118.a.d.d._4_4_,uVar10);
  local_118.a.d.ptr = extraout_RDX;
  dVar21 = (double)QTextLine::naturalTextWidth();
  iVar7 = (int)((double)(((ulong)dVar21 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar21
               );
  iVar18 = ((int)local_138.d.ptr - (int)local_138.d.d) + 1;
  if (iVar7 < iVar18) {
    if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xfffffe0f) == 4) {
      iVar18 = ((iVar7 + 1) - iVar18) / 2;
    }
    else {
      if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xfffffe0f) != 2) {
        this_00->hscroll = 0;
        goto LAB_00422b82;
      }
LAB_00422b5d:
      iVar18 = (iVar7 - iVar18) + 2;
    }
    this_00->hscroll = iVar18;
  }
  else {
    iVar17 = (int)((double)((ulong)qVar3 & 0x8000000000000000 | 0x3fe0000000000000) + qVar3);
    iVar1 = this_00->hscroll;
    if (iVar17 - iVar1 < iVar18) {
      if ((iVar1 <= iVar17) || (iVar7 < iVar1)) {
        if ((iVar7 + 1) - iVar1 < iVar18) goto LAB_00422b5d;
        iVar18 = 0;
        if (0 < iVar1) {
          iVar18 = iVar1;
        }
        this_00->hscroll = iVar18;
        goto LAB_00422b82;
      }
    }
    else {
      iVar17 = (iVar17 - iVar18) + 1;
    }
    this_00->hscroll = iVar17;
  }
LAB_00422b82:
  local_158 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QVar19.xp.m_i = (int)local_138.d.d - this_00->hscroll;
  iVar7 = local_138.d.d._4_4_ - this_00->control->m_ascent;
  iVar18 = QFontMetrics::ascent();
  QVar19.yp.m_i = iVar18 + iVar7;
  local_158 = QVar19;
  QWidget::style(&this->super_QWidget);
  this_01 = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (this_01 != (QStyleSheetStyle *)0x0) {
    QStyleSheetStyle::styleSheetPalette
              (this_01,&this->super_QWidget,(QStyleOption *)local_98,(QPalette *)local_48);
  }
  QPalette::brush((ColorGroup)local_48,Dark);
  QPainter::setPen((QColor *)local_c0);
  pQVar2 = this_00->control;
  if (((pQVar2->m_text).d.size == 0) || (pQVar2->m_selend <= pQVar2->m_selstart)) {
    if ((this_00->field_0x27c & 4) == 0) {
      bVar20 = false;
    }
    else {
      QWidgetLineControl::inputMask(&local_118.a,(QWidgetLineControl *)pQVar2);
      bVar4 = true;
      bVar20 = true;
      if ((undefined1 *)local_118.a.d.size != (undefined1 *)0x0) {
        bVar20 = (this_00->control->field_0x50 & 4) == 0;
        goto LAB_00422c7c;
      }
    }
    bVar4 = bVar20;
    bVar20 = false;
  }
  else {
    bVar4 = false;
    bVar20 = true;
  }
LAB_00422c7c:
  if ((bVar4) && (&(local_118.a.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_118.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar18 = 1;
  if (bVar20) {
    cVar6 = QPalette::operator==(&this_00->control->m_palette,(QPalette *)local_48);
    if ((cVar6 == '\0') ||
       (iVar18 = 3, (this_00->control->m_palette).currentGroup != local_48._8_4_)) {
      QPalette::operator=(&this_00->control->m_palette,(QPalette *)local_48);
      iVar18 = 3;
    }
  }
  if (((this_00->field_0x27c & 4) == 0) || ((this_00->control->field_0x50 & 4) != 0)) {
    bVar4 = false;
    bVar20 = false;
  }
  else {
    QWidgetLineControl::inputMask(&local_b8,(QWidgetLineControl *)this_00->control);
    bVar20 = local_b8.d.size == 0;
    bVar4 = true;
  }
  if ((bVar4) && (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar7 = iVar18 + 4;
  if (!bVar20) {
    iVar7 = iVar18;
  }
  pQVar2 = this_00->control;
  pQVar12 = QWidget::style(&this->super_QWidget);
  iVar18 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x52,(QStyleOption *)local_98,this);
  pQVar2->m_cursorWidth = iVar18;
  QWidgetLineControl::draw
            ((QWidgetLineControl *)this_00->control,(QPainter *)local_c0,&local_158,
             (QRect *)local_d8,iVar7);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_e0);
  QStyleOption::~QStyleOption((QStyleOption *)local_98);
  QPalette::~QPalette((QPalette *)local_48);
  QPainter::~QPainter((QPainter *)local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::paintEvent(QPaintEvent *)
{
    Q_D(QLineEdit);
    QPainter p(this);
    QPalette pal = palette();

    QStyleOptionFrame panel;
    initStyleOption(&panel);
    style()->drawPrimitive(QStyle::PE_PanelLineEdit, &panel, &p, this);
    QRect r = style()->subElementRect(QStyle::SE_LineEditContents, &panel, this);
    r = r.marginsRemoved(d->effectiveTextMargins());
    p.setClipRect(r);

    QFontMetrics fm = fontMetrics();
    int fmHeight = 0;
    if (d->shouldShowPlaceholderText())
        fmHeight = fm.boundingRect(d->placeholderText).height();
    else
        fmHeight = fm.boundingRect(d->control->text() + d->control->preeditAreaText()).height();
    fmHeight = qMax(fmHeight, fm.height());

    Qt::Alignment va = QStyle::visualAlignment(d->control->layoutDirection(), QFlag(d->alignment));
    switch (va & Qt::AlignVertical_Mask) {
     case Qt::AlignBottom:
         d->vscroll = r.y() + r.height() - fmHeight - QLineEditPrivate::verticalMargin;
         break;
     case Qt::AlignTop:
         d->vscroll = r.y() + QLineEditPrivate::verticalMargin;
         break;
     default:
         //center
         d->vscroll = r.y() + (r.height() - fmHeight + 1) / 2;
         break;
    }
    QRect lineRect(r.x() + QLineEditPrivate::horizontalMargin, d->vscroll,
                   r.width() - 2 * QLineEditPrivate::horizontalMargin, fmHeight);

    if (d->shouldShowPlaceholderText()) {
        if (!d->placeholderText.isEmpty()) {
            const Qt::LayoutDirection layoutDir = d->placeholderText.isRightToLeft() ? Qt::RightToLeft : Qt::LeftToRight;
            const Qt::Alignment alignPhText = QStyle::visualAlignment(layoutDir, QFlag(d->alignment));
            const QColor col = pal.placeholderText().color();
            QPen oldpen = p.pen();
            p.setPen(col);
            Qt::LayoutDirection oldLayoutDir = p.layoutDirection();
            p.setLayoutDirection(layoutDir);

            const QString elidedText = fm.elidedText(d->placeholderText, Qt::ElideRight, lineRect.width());
            p.drawText(lineRect, alignPhText, elidedText);
            p.setPen(oldpen);
            p.setLayoutDirection(oldLayoutDir);
        }
    }

    int cix = qRound(d->control->cursorToX());

    // horizontal scrolling. d->hscroll is the left indent from the beginning
    // of the text line to the left edge of lineRect. we update this value
    // depending on the delta from the last paint event; in effect this means
    // the below code handles all scrolling based on the textline (widthUsed),
    // the line edit rect (lineRect) and the cursor position (cix).
    int widthUsed = qRound(d->control->naturalTextWidth()) + 1;
    if (widthUsed <= lineRect.width()) {
        // text fits in lineRect; use hscroll for alignment
        switch (va & ~(Qt::AlignAbsolute|Qt::AlignVertical_Mask)) {
        case Qt::AlignRight:
            d->hscroll = widthUsed - lineRect.width() + 1;
            break;
        case Qt::AlignHCenter:
            d->hscroll = (widthUsed - lineRect.width()) / 2;
            break;
        default:
            // Left
            d->hscroll = 0;
            break;
        }
    } else if (cix - d->hscroll >= lineRect.width()) {
        // text doesn't fit, cursor is to the right of lineRect (scroll right)
        d->hscroll = cix - lineRect.width() + 1;
    } else if (cix - d->hscroll < 0 && d->hscroll < widthUsed) {
        // text doesn't fit, cursor is to the left of lineRect (scroll left)
        d->hscroll = cix;
    } else if (widthUsed - d->hscroll < lineRect.width()) {
        // text doesn't fit, text document is to the left of lineRect; align
        // right
        d->hscroll = widthUsed - lineRect.width() + 1;
    } else {
        //in case the text is bigger than the lineedit, the hscroll can never be negative
        d->hscroll = qMax(0, d->hscroll);
    }

    // the y offset is there to keep the baseline constant in case we have script changes in the text.
    // Needs to be kept in sync with QLineEditPrivate::adjustedControlRect
    QPoint topLeft = lineRect.topLeft() - QPoint(d->hscroll, d->control->ascent() - fm.ascent());

    // draw text, selections and cursors
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle* cssStyle = qt_styleSheet(style())) {
        cssStyle->styleSheetPalette(this, &panel, &pal);
    }
#endif
    p.setPen(pal.text().color());

    int flags = QWidgetLineControl::DrawText;

#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || hasEditFocus())
#endif
    if (d->control->hasSelectedText() || (d->cursorVisible && !d->control->inputMask().isEmpty() && !d->control->isReadOnly())){
        flags |= QWidgetLineControl::DrawSelections;
        // Palette only used for selections/mask and may not be in sync
        if (d->control->palette() != pal
           || d->control->palette().currentColorGroup() != pal.currentColorGroup())
            d->control->setPalette(pal);
    }

    // Asian users see an IM selection text as cursor on candidate
    // selection phase of input method, so the ordinary cursor should be
    // invisible if we have a preedit string. another condition is when inputmask
    // isn't empty,we don't need draw cursor,because cursor and character overlapping
    // area is white.
    if (d->cursorVisible && !d->control->isReadOnly() && d->control->inputMask().isEmpty())
        flags |= QWidgetLineControl::DrawCursor;

    d->control->setCursorWidth(style()->pixelMetric(QStyle::PM_TextCursorWidth, &panel, this));
    d->control->draw(&p, topLeft, r, flags);

}